

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O3

int __thiscall
MlmWrap::calculateDeviceChannelInfoIndices
          (MlmWrap *this,vector<int,_std::allocator<int>_> *indices,
          vector<int,_std::allocator<int>_> *startlengths,int startbyte,int bit)

{
  pointer piVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  iterator iVar6;
  int iVar7;
  int local_20;
  int local_1c;
  
  piVar1 = (startlengths->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(startlengths->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  if (lVar3 != 0) {
    uVar5 = 0;
    iVar4 = 0;
    iVar7 = 0;
    do {
      iVar4 = (piVar1[uVar5] - iVar7) + iVar4;
      iVar7 = piVar1[uVar5] + piVar1[uVar5 + 1];
      if (startbyte < iVar7) {
        local_20 = startbyte - iVar4;
        iVar6._M_current =
             (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        piVar2 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        local_1c = bit;
        if (iVar6._M_current == piVar2) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(indices,iVar6,&local_20);
          iVar6._M_current =
               (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          piVar2 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar6._M_current = local_20;
          iVar6._M_current = iVar6._M_current + 1;
          (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar6._M_current;
        }
        if (iVar6._M_current != piVar2) {
          *iVar6._M_current = bit;
          (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar6._M_current + 1;
          return iVar4;
        }
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)indices,iVar6,&local_1c);
        return iVar4;
      }
      uVar5 = uVar5 + 2;
    } while (uVar5 < (ulong)(lVar3 >> 2));
  }
  return -1;
}

Assistant:

int MlmWrap::calculateDeviceChannelInfoIndices(std::vector<int> &indices, std::vector<int>& startlengths, int startbyte, int bit){
    //push back index, adjusted for analog's dataformat
    //returns the gap, which when subtracted from startbyte (start byte in trodes packet), returns the startbyte of the actual analog packet
    int prev = 0;
    int gap = 0;
    for(size_t i = 0; i < startlengths.size(); i+=2){
        gap += startlengths[i] - prev;
        prev = startlengths[i] + startlengths[i+1];
        if(startbyte < startlengths[i] + startlengths[i+1]){
            //Channel in this block. subtract total gap
            indices.push_back(startbyte - gap);
            indices.push_back(bit);
            return gap;
        }
    }
    return -1;
}